

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.c
# Opt level: O0

int xmlPatternMinDepth(xmlPatternPtr comp)

{
  int local_1c;
  _xmlPattern *p_Stack_18;
  int ret;
  xmlPatternPtr comp_local;
  
  local_1c = 0xbc614e;
  p_Stack_18 = comp;
  if (comp == (xmlPatternPtr)0x0) {
    comp_local._4_4_ = -1;
  }
  else {
    for (; p_Stack_18 != (xmlPatternPtr)0x0; p_Stack_18 = p_Stack_18->next) {
      if (p_Stack_18->stream == (xmlStreamCompPtr)0x0) {
        return -1;
      }
      if (p_Stack_18->stream->nbStep < local_1c) {
        local_1c = p_Stack_18->stream->nbStep;
      }
      if (local_1c == 0) {
        return 0;
      }
    }
    comp_local._4_4_ = local_1c;
  }
  return comp_local._4_4_;
}

Assistant:

int
xmlPatternMinDepth(xmlPatternPtr comp) {
    int ret = 12345678;
    if (comp == NULL)
        return(-1);
    while (comp != NULL) {
        if (comp->stream == NULL)
	    return(-1);
	if (comp->stream->nbStep < ret)
	    ret = comp->stream->nbStep;
	if (ret == 0)
	    return(0);
	comp = comp->next;
    }
    return(ret);
}